

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O0

void __thiscall kratos::DebugInfoVisitor::visit(DebugInfoVisitor *this,SwitchStmt *stmt)

{
  SwitchStmt *stmt_local;
  DebugInfoVisitor *this_local;
  
  add_info(this,&stmt->super_Stmt);
  return;
}

Assistant:

void visit(SwitchStmt *stmt) override { add_info(stmt); }